

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectDependRules
          (cmMakefileTargetGenerator *this,cmSourceFile *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  string *__x;
  cmValue cVar1;
  string_view arg;
  allocator<char> local_39;
  string local_38;
  
  __x = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(depends,__x);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"OBJECT_DEPENDS",&local_39)
  ;
  cVar1 = cmSourceFile::GetProperty(source,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar1.Value != (string *)0x0) {
    arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar1.Value)->_M_string_length;
    cmExpandList(arg,depends,false);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectDependRules(
  cmSourceFile const& source, std::vector<std::string>& depends)
{
  // Create the list of dependencies known at cmake time.  These are
  // shared between the object file and dependency scanning rule.
  depends.push_back(source.GetFullPath());
  if (cmValue objectDeps = source.GetProperty("OBJECT_DEPENDS")) {
    cmExpandList(*objectDeps, depends);
  }
}